

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

WhereBroadcastableLayerParams * __thiscall
CoreML::Specification::WhereBroadcastableLayerParams::New
          (WhereBroadcastableLayerParams *this,Arena *arena)

{
  WhereBroadcastableLayerParams *this_00;
  
  this_00 = (WhereBroadcastableLayerParams *)operator_new(0x18);
  WhereBroadcastableLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::WhereBroadcastableLayerParams>
              (arena,this_00);
  }
  return this_00;
}

Assistant:

WhereBroadcastableLayerParams* WhereBroadcastableLayerParams::New(::google::protobuf::Arena* arena) const {
  WhereBroadcastableLayerParams* n = new WhereBroadcastableLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}